

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

bool Remove(Vector *V,int i)

{
  ElementType *pEVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  
  if (V->VectorLength == 0) {
    pcVar4 = "Vector is empty!";
    lVar3 = 0x10;
  }
  else {
    if (i < V->VectorLength && -1 < i) {
      if (V->VectorLength < 3) {
        uVar2 = (ulong)(V->VectorLength - 1);
      }
      else {
        pEVar1 = V->elements;
        lVar3 = 1;
        do {
          pEVar1[lVar3] = pEVar1[lVar3 + 1];
          lVar3 = lVar3 + 1;
          uVar2 = (long)V->VectorLength - 1;
        } while (lVar3 < (long)uVar2);
      }
      V->VectorLength = (int)uVar2;
      return true;
    }
    pcVar4 = "position error!";
    lVar3 = 0xf;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return false;
}

Assistant:

bool Remove(Vector *V,int i)  //删除向量的第i个表目
{
    if(V->VectorLength == 0)  //空向量
    {
        cout << "Vector is empty!" << endl;
        return false;
    }
    else if(i<0||i>V->VectorLength-1)  //删除位置错误
    {
        cout << "position error!" << endl;
        return false;
    }
    else {
        int j;
        for (j = 1; j < V->VectorLength - 1; j++)  //前移
            V->elements[j] = V->elements[j+1];
        V->VectorLength--;   //向量长度减1
        return true;
    }
}